

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxdn.cpp
# Opt level: O3

void __thiscall DSDcc::DSDNXDN::processVoiceFrameEFR(DSDNXDN *this,int symbolIndex,int dibit)

{
  char cVar1;
  byte bVar2;
  DSDDecoder *pDVar3;
  double in_XMM0_Qa;
  
  pDVar3 = this->m_dsdDecoder;
  if ((symbolIndex == 0) && ((pDVar3->m_opts).errorbars == 1)) {
    in_XMM0_Qa = DSDLogger::log(&pDVar3->m_dsdLogger,in_XMM0_Qa);
    pDVar3 = this->m_dsdDecoder;
  }
  if (pDVar3->m_mbelibEnable == false) {
    cVar1 = (char)(symbolIndex % 0x48);
    bVar2 = ((byte)(cVar1 >> 7) >> 6) + cVar1;
    pDVar3->m_mbeDVFrame1[(char)bVar2 >> 2] =
         pDVar3->m_mbeDVFrame1[(char)bVar2 >> 2] |
         (byte)(dibit << ((cVar1 - (bVar2 & 0x7c)) * -2 + 6 & 0x1f));
  }
  if (symbolIndex % 0x48 == 0x47) {
    pDVar3 = this->m_dsdDecoder;
    pDVar3->m_mbeDVReady1 = true;
    if ((pDVar3->m_opts).errorbars == 1) {
      DSDLogger::log(&pDVar3->m_dsdLogger,in_XMM0_Qa);
      return;
    }
  }
  return;
}

Assistant:

void DSDNXDN::processVoiceFrameEFR(int symbolIndex, int dibit)
{
    if ((symbolIndex == 0) && (m_dsdDecoder->m_opts.errorbars == 1))
    {
        m_dsdDecoder->getLogger().log("\nMBE: ");
    }

    storeSymbolDV(symbolIndex % 72, dibit);

    if (symbolIndex % 72 == 71)
    {
        m_dsdDecoder->m_mbeDVReady1 = true; // Indicate that a DVSI frame is available

        if (m_dsdDecoder->m_opts.errorbars == 1)
        {
            m_dsdDecoder->getLogger().log(".");
        }
    }
}